

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerTextureCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerTextureCase *this,int measurementNdx
          )

{
  ConditionalUsage CVar1;
  ConditionalType CVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  long *plVar7;
  pointer pAVar8;
  size_type *psVar9;
  int iVar10;
  long lVar11;
  undefined4 *puVar12;
  uint cacheAvoidanceID;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ConditionalType in_R8D;
  int iVar14;
  string *shaderSourceTemplate;
  float fVar15;
  ProgramContext *result;
  Vector<float,_16> result_1;
  string nameSpec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  ProgramContext *local_2c0;
  undefined1 local_2b8 [24];
  long lStack_2a0;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  float local_278 [18];
  ConditionalType local_230;
  ConditionalUsage local_22c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  pointer local_218;
  string local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [36];
  undefined1 auStack_184 [8];
  undefined1 auStack_17c [12];
  float afStack_170 [2];
  float local_168 [2];
  float afStack_160 [2];
  float local_158 [2];
  float afStack_150 [6];
  ios_base local_138 [264];
  
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar6 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar6 ^ uVar6 >> 0xf;
  }
  local_2c0 = __return_storage_ptr__;
  getNameSpecialization_abi_cxx11_(&local_208,(Performance *)(ulong)cacheAvoidanceID,measurementNdx)
  ;
  (local_2c0->vertShaderSource)._M_dataplus._M_p = (pointer)&(local_2c0->vertShaderSource).field_2;
  (local_2c0->vertShaderSource)._M_string_length = 0;
  (local_2c0->vertShaderSource).field_2._M_local_buf[0] = '\0';
  paVar13 = &(local_2c0->fragShaderSource).field_2;
  (local_2c0->fragShaderSource)._M_dataplus._M_p = (pointer)paVar13;
  (local_2c0->fragShaderSource)._M_string_length = 0;
  (local_2c0->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  textureLookupVertexTemplate_abi_cxx11_
            ((string *)local_298,(Performance *)(ulong)this->m_conditionalUsage,
             this->m_conditionalType,(ConditionalType)paVar13);
  specializeShaderSource
            ((string *)local_1a8,(string *)local_298,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)local_2c0,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  textureLookupFragmentTemplate_abi_cxx11_
            ((string *)local_298,(Performance *)(ulong)(uint)this->m_numLookups,
             this->m_conditionalUsage,this->m_conditionalType,in_R8D);
  shaderSourceTemplate = (string *)local_298;
  specializeShaderSource
            ((string *)local_1a8,shaderSourceTemplate,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)&local_2c0->fragShaderSource,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  CVar1 = this->m_conditionalUsage;
  CVar2 = this->m_conditionalType;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  std::operator+(&local_2e0,"a_position",&local_208);
  local_1e8._M_allocated_capacity = 0xbf800000bf800000;
  local_1e8._8_8_ = 0x3f80000000000000;
  local_228._M_allocated_capacity = 0x3f800000bf800000;
  local_228._8_8_ = 0x3f80000000000000;
  local_1b8._M_allocated_capacity = 0xbf8000003f800000;
  local_1b8._8_8_ = 0x3f80000000000000;
  local_1c8._M_allocated_capacity = 0x3f8000003f800000;
  local_1c8._8_8_ = 0x3f80000000000000;
  local_298 = (undefined1  [8])0x0;
  uStack_290 = 0;
  local_288._M_allocated_capacity = 0;
  local_288._8_8_ = 0;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  local_278[3] = 0.0;
  local_278[4] = 0.0;
  local_278[5] = 0.0;
  local_278[6] = 0.0;
  local_278[7] = 0.0;
  lVar11 = 0;
  do {
    iVar10 = (int)lVar11;
    paVar13 = &local_1e8;
    if (((iVar10 != 0) && (paVar13 = &local_228, iVar10 != 1)) &&
       (paVar13 = &local_1c8, iVar10 == 2)) {
      paVar13 = &local_1b8;
    }
    uVar3 = *(undefined4 *)((long)paVar13 + 4);
    uVar4 = *(undefined4 *)((long)paVar13 + 8);
    uVar5 = *(undefined4 *)((long)paVar13 + 0xc);
    *(undefined4 *)&(shaderSourceTemplate->_M_dataplus)._M_p = *(undefined4 *)paVar13;
    *(undefined4 *)((long)&(shaderSourceTemplate->_M_dataplus)._M_p + 4) = uVar3;
    *(undefined4 *)&shaderSourceTemplate->_M_string_length = uVar4;
    *(undefined4 *)((long)&shaderSourceTemplate->_M_string_length + 4) = uVar5;
    lVar11 = lVar11 + 1;
    shaderSourceTemplate = (string *)&shaderSourceTemplate->field_2;
  } while (lVar11 != 4);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_2e0._M_dataplus._M_p,
             local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
  local_158[0] = local_278[4];
  local_158[1] = local_278[5];
  afStack_150[0] = local_278[6];
  afStack_150[1] = local_278[7];
  local_168[0] = local_278[0];
  local_168[1] = local_278[1];
  afStack_160[0] = local_278[2];
  afStack_160[1] = local_278[3];
  auStack_17c._4_8_ = local_288._M_allocated_capacity;
  afStack_170[0] = (float)local_288._8_4_;
  afStack_170[1] = (float)local_288._12_4_;
  stack0xfffffffffffffe78 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_298;
  stack0xfffffffffffffe80 = uStack_290;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_2b8,(AttribSpec *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2e0,"a_coords",&local_208);
  local_1e8._M_allocated_capacity = 0;
  local_1e8._8_8_ = 0;
  local_228._M_allocated_capacity = 0x3f80000000000000;
  local_228._8_8_ = 0;
  local_1b8._M_allocated_capacity = 0x3f800000;
  local_1b8._8_8_ = 0;
  local_1c8._M_allocated_capacity = 0x3f8000003f800000;
  local_1c8._8_8_ = 0;
  puVar12 = (undefined4 *)local_298;
  local_298 = (undefined1  [8])0x0;
  uStack_290 = 0;
  local_288._M_allocated_capacity = 0;
  local_288._8_8_ = 0;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  local_278[3] = 0.0;
  local_278[4] = 0.0;
  local_278[5] = 0.0;
  local_278[6] = 0.0;
  local_278[7] = 0.0;
  lVar11 = 0;
  do {
    iVar10 = (int)lVar11;
    paVar13 = &local_1e8;
    if (((iVar10 != 0) && (paVar13 = &local_228, iVar10 != 1)) &&
       (paVar13 = &local_1c8, iVar10 == 2)) {
      paVar13 = &local_1b8;
    }
    uVar3 = *(undefined4 *)((long)paVar13 + 4);
    uVar4 = *(undefined4 *)((long)paVar13 + 8);
    uVar5 = *(undefined4 *)((long)paVar13 + 0xc);
    *puVar12 = *(undefined4 *)paVar13;
    puVar12[1] = uVar3;
    puVar12[2] = uVar4;
    puVar12[3] = uVar5;
    lVar11 = lVar11 + 1;
    puVar12 = puVar12 + 4;
  } while (lVar11 != 4);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_2e0._M_dataplus._M_p,
             local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
  local_158[0] = local_278[4];
  local_158[1] = local_278[5];
  afStack_150[0] = local_278[6];
  afStack_150[1] = local_278[7];
  local_168[0] = local_278[0];
  local_168[1] = local_278[1];
  afStack_160[0] = local_278[2];
  afStack_160[1] = local_278[3];
  auStack_17c._4_8_ = local_288._M_allocated_capacity;
  afStack_170[0] = (float)local_288._8_4_;
  afStack_170[1] = (float)local_288._12_4_;
  stack0xfffffffffffffe78 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_298;
  stack0xfffffffffffffe80 = uStack_290;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_2b8,(AttribSpec *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((CVar1 != CONDITIONAL_USAGE_NONE) && (CVar2 == CONDITIONAL_TYPE_DYNAMIC)) {
    std::operator+(&local_2e0,"a_condition",&local_208);
    local_1e8._M_allocated_capacity = 0x3f8000003f800000;
    local_1e8._8_8_ = 0x3f8000003f800000;
    local_228._M_allocated_capacity = 0x3f8000003f800000;
    local_228._8_8_ = 0x3f8000003f800000;
    local_1b8._M_allocated_capacity = 0x3f8000003f800000;
    local_1b8._8_8_ = 0x3f8000003f800000;
    local_1c8._M_allocated_capacity = 0x3f8000003f800000;
    local_1c8._8_8_ = 0x3f8000003f800000;
    puVar12 = (undefined4 *)local_298;
    local_298 = (undefined1  [8])0x0;
    uStack_290 = 0;
    local_288._M_allocated_capacity = 0;
    local_288._8_8_ = 0;
    local_278[0] = 0.0;
    local_278[1] = 0.0;
    local_278[2] = 0.0;
    local_278[3] = 0.0;
    local_278[4] = 0.0;
    local_278[5] = 0.0;
    local_278[6] = 0.0;
    local_278[7] = 0.0;
    lVar11 = 0;
    do {
      iVar10 = (int)lVar11;
      paVar13 = &local_1e8;
      if (((iVar10 != 0) && (paVar13 = &local_228, iVar10 != 1)) &&
         (paVar13 = &local_1c8, iVar10 == 2)) {
        paVar13 = &local_1b8;
      }
      uVar3 = *(undefined4 *)((long)paVar13 + 4);
      uVar4 = *(undefined4 *)((long)paVar13 + 8);
      uVar5 = *(undefined4 *)((long)paVar13 + 0xc);
      *puVar12 = *(undefined4 *)paVar13;
      puVar12[1] = uVar3;
      puVar12[2] = uVar4;
      puVar12[3] = uVar5;
      lVar11 = lVar11 + 1;
      puVar12 = puVar12 + 4;
    } while (lVar11 != 4);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    local_158[0] = local_278[4];
    local_158[1] = local_278[5];
    afStack_150[0] = local_278[6];
    afStack_150[1] = local_278[7];
    local_168[0] = local_278[0];
    local_168[1] = local_278[1];
    afStack_160[0] = local_278[2];
    afStack_160[1] = local_278[3];
    auStack_17c._4_8_ = local_288._M_allocated_capacity;
    afStack_170[0] = (float)local_288._8_4_;
    afStack_170[1] = (float)local_288._12_4_;
    stack0xfffffffffffffe78 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_298;
    stack0xfffffffffffffe80 = uStack_290;
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
              ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                *)local_2b8,(AttribSpec *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_1a8._16_8_ =
       (local_2c0->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2b8._16_8_;
  local_1a8._0_8_ =
       (local_2c0->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       (local_2c0->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8._0_8_;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2b8._8_8_;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  iVar14 = 0;
  local_2b8._16_8_ = (pointer)0x0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_1a8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_2b8);
  iVar10 = this->m_numLookups;
  local_22c = this->m_conditionalUsage;
  local_230 = this->m_conditionalType;
  local_218 = (pointer)0x0;
  local_228._M_allocated_capacity = 0;
  local_228._8_8_ = (pointer)0x0;
  if (0 < iVar10) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,0x1be1792);
      pAVar8 = (pointer)(plVar7 + 2);
      if ((pointer)*plVar7 == pAVar8) {
        local_2b8._16_8_ = (pAVar8->name)._M_dataplus._M_p;
        lStack_2a0 = plVar7[3];
        local_2b8._0_8_ = (pointer)(local_2b8 + 0x10);
      }
      else {
        local_2b8._16_8_ = (pAVar8->name)._M_dataplus._M_p;
        local_2b8._0_8_ = (pointer)*plVar7;
      }
      local_2b8._8_8_ = plVar7[1];
      *plVar7 = (long)pAVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append(local_2b8,(ulong)local_208._M_dataplus._M_p);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2e0.field_2._M_allocated_capacity = *psVar9;
        local_2e0.field_2._8_4_ = (undefined4)plVar7[3];
        local_2e0.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *psVar9;
        local_2e0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2e0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_298 = (undefined1  [8])&local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_298,local_2e0._M_dataplus._M_p,
                 local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
      fVar15 = (float)iVar14;
      local_278[0] = 8.40779e-45;
      lVar11 = 9;
      do {
        *(float *)(local_298 + lVar11 * 4) = fVar15;
        *(float *)(local_298 + lVar11 * 4 + 4) = fVar15;
        *(float *)((long)&uStack_290 + lVar11 * 4) = fVar15;
        *(float *)((long)&uStack_290 + (lVar11 + 1) * 4) = fVar15;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x19);
      std::
      vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>
                ((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                  *)&local_228,(UniformSpec *)local_298);
      if (local_298 != (undefined1  [8])&local_288) {
        operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_,
                        (ulong)((long)&(((string *)local_2b8._16_8_)->_M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_allocated_capacity != &local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity,local_1d8._M_allocated_capacity + 1)
        ;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != iVar10);
  }
  if ((local_22c != CONDITIONAL_USAGE_NONE) && (local_230 == CONDITIONAL_TYPE_UNIFORM)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   "u_condition",&local_208);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_298,(char *)((long)local_298 + uStack_290));
    stack0xfffffffffffffe78 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((ulong)stack0xfffffffffffffe78 & 0xffffffff00000000);
    lVar11 = 9;
    do {
      *(undefined8 *)(local_1a8 + lVar11 * 4) = 0x3f8000003f800000;
      *(undefined8 *)(local_1a8 + lVar11 * 4 + 8) = 0x3f8000003f800000;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x19);
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>
              ((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                *)&local_228,(UniformSpec *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if (local_298 != (undefined1  [8])&local_288) {
      operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
    }
  }
  local_1a8._16_8_ =
       (local_2c0->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
  local_1a8._0_8_ =
       (local_2c0->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       (local_2c0->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_allocated_capacity;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
  local_228._M_allocated_capacity = 0;
  local_228._8_8_ = 0;
  local_218 = (pointer)0x0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             *)local_1a8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return local_2c0;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerTextureCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(textureLookupVertexTemplate(m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(textureLookupFragmentTemplate(m_numLookups, m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.vertexAttributes		= textureLookupShaderAttributes(nameSpec, m_conditionalUsage, m_conditionalType);
	result.uniforms				= textureLookupShaderUniforms(nameSpec, m_numLookups, m_conditionalUsage, m_conditionalType);

	return result;
}